

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O3

bool ispring::File::DirectoryCopy(string *src,string *dst)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  string cmd;
  long *local_78;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"cp -r ",src);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)(dst->_M_dataplus)._M_p)
  ;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = system((char *)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  return iVar1 == 0;
}

Assistant:

inline bool DirectoryCopy(std::string src, std::string dst) {
			std::string cmd="cp -r " + src + " " + dst;
			return system(cmd.c_str())==0;
		}